

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O2

int mixed_make_segment_info(char *name,uint32_t *argc,mixed_segment_field_info **args)

{
  int iVar1;
  mixed_segment_field_info *pmVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = (ulong)segments.count;
  pmVar2 = segments.entries[0].args;
  while( true ) {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      mixed_err(0x18);
      return 0;
    }
    if ((*(mixed_make_segment_function *)&pmVar2[-1].type_count != (mixed_make_segment_function)0x0)
       && (iVar1 = strcmp((char *)&pmVar2[-3].flags,name), iVar1 == 0)) break;
    pmVar2 = (mixed_segment_field_info *)&pmVar2[0x22].flags;
  }
  *argc = pmVar2[-1].flags;
  *args = pmVar2;
  return 1;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_info(const char *name, uint32_t *argc, const struct mixed_segment_field_info **args){
  for(uint32_t i=0; i<segments.count; ++i){
    struct segment_entry *entry = &segments.entries[i];
    if(entry->function && strcmp(entry->name, name) == 0){
      *argc = entry->argc;
      *args = entry->args;
      return 1;
    }
  }
  mixed_err(MIXED_BAD_SEGMENT);
  return 0;
}